

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

void __thiscall CTextRender::LoadFonts(CTextRender *this,IStorage *pStorage,IConsole *pConsole)

{
  long lVar1;
  CGlyphMap *this_00;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  char *pcVar6;
  json_value *this_01;
  _json_value *p_Var7;
  _json_value *p_Var8;
  undefined4 extraout_var_00;
  void *buffer;
  CFontLanguageVariant *pCVar9;
  uint i_1;
  uint uVar10;
  char *dst;
  int i_2;
  long lVar11;
  uint i;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  json_settings JsonSettings;
  char aBuf [256];
  char aFilename [512];
  char aFontName [512];
  char aError [256];
  IOHANDLE pIVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*(pStorage->super_IInterface)._vptr_IInterface[4])
                    (pStorage,"fonts/index.json",1,0xffffffffffffffff,0,0,0,0);
  pIVar4 = (IOHANDLE)CONCAT44(extraout_var,iVar3);
  if (pIVar4 == (IOHANDLE)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      (*(pConsole->super_IInterface)._vptr_IInterface[0x19])
                (pConsole,1,"textrender","couldn\'t open fonts index file",0);
      return;
    }
  }
  else {
    lVar5 = io_length(pIVar4);
    uVar10 = (uint)lVar5;
    pcVar6 = (char *)mem_alloc(uVar10);
    io_read(pIVar4,pcVar6,uVar10);
    io_close(pIVar4);
    mem_zero(&JsonSettings,0x30);
    this_01 = json_parse_ex(&JsonSettings,pcVar6,(long)(int)uVar10,aError);
    mem_free(pcVar6);
    if (this_01 == (json_value *)0x0) {
      (*(pConsole->super_IInterface)._vptr_IInterface[0x19])(pConsole,1,"fonts/index.json",aError,0)
      ;
    }
    else {
      p_Var7 = _json_value::operator[](this_01,"font files");
      if (p_Var7->type == json_array) {
        for (uVar12 = 0; (uVar12 < 0x10 && (uVar12 < (p_Var7->u).string.length));
            uVar12 = uVar12 + 1) {
          p_Var8 = _json_value::operator[](p_Var7,(int)uVar12);
          pcVar6 = "";
          if (p_Var8->type == json_string) {
            pcVar6 = (p_Var8->u).string.ptr;
          }
          str_format(aFontName,0x200,"fonts/%s",pcVar6);
          iVar3 = (*(pStorage->super_IInterface)._vptr_IInterface[4])
                            (pStorage,aFontName,1,0xffffffffffffffff,aFilename,0x200,0,0);
          pIVar4 = (IOHANDLE)CONCAT44(extraout_var_00,iVar3);
          if (pIVar4 != (IOHANDLE)0x0) {
            lVar5 = io_length(pIVar4);
            buffer = mem_alloc((uint)lVar5);
            this->m_apFontData[uVar12] = buffer;
            io_read(pIVar4,buffer,(uint)lVar5);
            io_close(pIVar4);
            iVar3 = LoadFontCollection(this,aFilename,this->m_apFontData[uVar12],lVar5);
            if (iVar3 != 0) {
              str_format(aBuf,0x100,"failed to load font. filename=\'%s\'",aFontName);
              (*(pConsole->super_IInterface)._vptr_IInterface[0x19])(pConsole,0,"textrender",aBuf,0)
              ;
            }
          }
        }
      }
      p_Var7 = _json_value::operator[](this_01,"default");
      if (p_Var7->type == json_string) {
        CGlyphMap::SetDefaultFaceByName(this->m_pGlyphMap,(p_Var7->u).string.ptr);
      }
      p_Var7 = _json_value::operator[](this_01,"fallbacks");
      if (p_Var7->type == json_array) {
        for (uVar10 = 0; uVar10 < (p_Var7->u).string.length; uVar10 = uVar10 + 1) {
          this_00 = this->m_pGlyphMap;
          p_Var8 = _json_value::operator[](p_Var7,uVar10);
          pcVar6 = "";
          if (p_Var8->type == json_string) {
            pcVar6 = (p_Var8->u).string.ptr;
          }
          CGlyphMap::AddFallbackFaceByName(this_00,pcVar6);
        }
      }
      p_Var7 = _json_value::operator[](this_01,"language variants");
      if (p_Var7->type == json_object) {
        iVar3 = (p_Var7->u).boolean;
        this->m_NumVariants = iVar3;
        pcVar6 = (p_Var7->u).string.ptr;
        pCVar9 = (CFontLanguageVariant *)mem_alloc(iVar3 * 0x280);
        this->m_paVariants = pCVar9;
        lVar5 = 0x200;
        lVar13 = 0;
        for (lVar11 = 0; lVar11 < this->m_NumVariants; lVar11 = lVar11 + 1) {
          str_format(aFontName,0x80,"languages/%s.json",*(undefined8 *)(pcVar6 + lVar13));
          str_copy((char *)((long)this->m_paVariants + lVar5 + -0x200),aFontName,0x200);
          lVar2 = *(long *)((long)&((p_Var7->u).object.values)->value + lVar13);
          dst = this->m_paVariants->m_aLanguageFile + lVar5;
          if (*(int *)(lVar2 + 8) == 5) {
            str_copy(dst,*(char **)(lVar2 + 0x18),0x80);
          }
          else {
            *dst = '\0';
          }
          lVar5 = lVar5 + 0x280;
          lVar13 = lVar13 + 0x18;
        }
      }
      json_value_free(this_01);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::LoadFonts(IStorage *pStorage, IConsole *pConsole)
{
	// read file data into buffer
	const char *pFilename = "fonts/index.json";

	IOHANDLE File = pStorage->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "textrender", "couldn't open fonts index file");
		return;
	}
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return;
	}

	// extract font file definitions
	const json_value &rFiles = (*pJsonData)["font files"];
	if(rFiles.type == json_array)
	{
		for(unsigned i = 0; i < rFiles.u.array.length && i < MAX_FACES; ++i)
		{
			char aFontName[IO_MAX_PATH_LENGTH];
			str_format(aFontName, sizeof(aFontName), "fonts/%s", (const char *)rFiles[i]);
			char aFilename[IO_MAX_PATH_LENGTH];
			IOHANDLE File = pStorage->OpenFile(aFontName, IOFLAG_READ, IStorage::TYPE_ALL, aFilename, sizeof(aFilename));
			if(File)
			{
				long FileSize = io_length(File);
				m_apFontData[i] = mem_alloc(FileSize);
				io_read(File, m_apFontData[i], FileSize);
				io_close(File);
				if(LoadFontCollection(aFilename, m_apFontData[i], FileSize))
				{
					char aBuf[256];	
					str_format(aBuf, sizeof(aBuf), "failed to load font. filename='%s'", aFontName);	
					pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "textrender", aBuf);
				}
			}
		}
	}

	// extract default family name
	const json_value &rDefaultFace = (*pJsonData)["default"];
	if(rDefaultFace.type == json_string)
	{
		m_pGlyphMap->SetDefaultFaceByName((const char *)rDefaultFace);
	}

	// extract fallback family names
	const json_value &rFallbackFaces = (*pJsonData)["fallbacks"];
	if(rFallbackFaces.type == json_array)
	{
		for(unsigned i = 0; i < rFallbackFaces.u.array.length; ++i)
		{
			m_pGlyphMap->AddFallbackFaceByName((const char *)rFallbackFaces[i]);
		}
	}

	// extract language variant family names
	const json_value &rVariant = (*pJsonData)["language variants"];
	if(rVariant.type == json_object)
	{
		m_NumVariants = rVariant.u.object.length;
		json_object_entry *Entries = rVariant.u.object.values;
		m_paVariants = (CFontLanguageVariant *)mem_alloc(sizeof(CFontLanguageVariant)*m_NumVariants);
		for(int i = 0; i < m_NumVariants; ++i)
		{
			char aFileName[128];
			str_format(aFileName, sizeof(aFileName), "languages/%s.json", (const char *)Entries[i].name);
			str_copy(m_paVariants[i].m_aLanguageFile, aFileName, sizeof(m_paVariants[i].m_aLanguageFile));

			json_value *pFamilyName = rVariant.u.object.values[i].value;
			if(pFamilyName->type == json_string)
				str_copy(m_paVariants[i].m_aFamilyName, pFamilyName->u.string.ptr, sizeof(m_paVariants[i].m_aFamilyName));
			else
				m_paVariants[i].m_aFamilyName[0] = 0;
		}
	}

	json_value_free(pJsonData);
}